

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes.c
# Opt level: O1

exr_result_t
exr_attr_list_add_static_name
          (exr_context_t ctxt,exr_attribute_list_t *list,char *name,exr_attribute_type_t type,
          int32_t data_len,uint8_t **data_ptr,exr_attribute_t **attr)

{
  _priv_exr_context_t _Var1;
  uint8_t uVar2;
  char *pcVar3;
  int iVar4;
  exr_result_t eVar5;
  size_t sVar6;
  undefined4 in_register_0000000c;
  uint uVar7;
  exr_attribute_t *nattr;
  exr_attribute_t **local_50;
  uint8_t **local_48;
  undefined8 local_40;
  exr_attribute_list_t *local_38;
  
  local_40 = CONCAT44(in_register_0000000c,type);
  nattr = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    eVar5 = 2;
  }
  else {
    local_50 = attr;
    eVar5 = validate_attr_arguments((_internal_exr_context *)ctxt,list,name,data_len,data_ptr,attr);
    if (eVar5 == 0) {
      _Var1 = ctxt[2];
      local_48 = data_ptr;
      local_38 = list;
      sVar6 = strlen(name);
      if ((byte)_Var1 < sVar6) {
        eVar5 = (**(code **)(ctxt + 0x48))
                          (ctxt,0xc,"Provided name \'%s\' too long for file (len %d, max %d)",name,
                           sVar6 & 0xffffffff,(ulong)(byte)_Var1);
        return eVar5;
      }
      iVar4 = (int)local_40;
      if (iVar4 - 0x1dU < 0xffffffe4) {
        if (iVar4 == 0x1d) {
          eVar5 = (**(code **)(ctxt + 0x48))
                            (ctxt,3,
                             "Invalid type enum for \'%s\': the opaque type is not actually a built-in type"
                             ,name);
          return eVar5;
        }
        eVar5 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"Invalid type enum for \'%s\' in create by builtin type (type %d)"
                           ,name);
        return eVar5;
      }
      uVar7 = iVar4 - 1;
      eVar5 = create_attr_block((_internal_exr_context *)ctxt,&nattr,
                                the_predefined_attr_typenames[uVar7].exp_size,data_len,local_48,
                                (char *)0x0,0,(char *)0x0,0);
      if (eVar5 == 0) {
        nattr->name = name;
        pcVar3 = the_predefined_attr_typenames[uVar7].name;
        nattr->type_name = pcVar3;
        nattr->name_length = (uint8_t)sVar6;
        uVar2 = (uint8_t)the_predefined_attr_typenames[uVar7].name_len;
        nattr->type_name_length = uVar2;
        nattr->type = the_predefined_attr_typenames[uVar7].type;
        eVar5 = add_to_list((_internal_exr_context *)ctxt,local_38,nattr,
                            (char *)CONCAT71((int7)((ulong)pcVar3 >> 8),uVar2));
      }
      if (eVar5 == 0) {
        *local_50 = nattr;
        check_attr_handler((_internal_exr_context *)ctxt,nattr);
      }
      else if (local_48 != (uint8_t **)0x0) {
        *local_48 = (uint8_t *)0x0;
      }
    }
    else if (eVar5 < 0) {
      nattr = *local_50;
      eVar5 = 0;
      if (nattr->type != (exr_attribute_type_t)local_40) {
        *local_50 = (exr_attribute_t *)0x0;
        eVar5 = (**(code **)(ctxt + 0x48))
                          (ctxt,3,"Entry \'%s\' already in list but with different type (\'%s\')",
                           name,nattr->type_name,*(code **)(ctxt + 0x48));
        return eVar5;
      }
    }
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_attr_list_add_static_name (
    exr_context_t         ctxt,
    exr_attribute_list_t* list,
    const char*           name,
    exr_attribute_type_t  type,
    int32_t               data_len,
    uint8_t**             data_ptr,
    exr_attribute_t**     attr)
{
    const struct _internal_exr_attr_map* known = NULL;

    int              rval = EXR_ERR_INVALID_ARGUMENT;
    int32_t          nlen, tidx, mlen;
    size_t           slen;
    exr_attribute_t* nattr = NULL;

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    rval =
        validate_attr_arguments (pctxt, list, name, data_len, data_ptr, attr);
    if (rval != EXR_ERR_SUCCESS)
    {
        if (rval < 0)
        {
            if ((*attr)->type != type)
            {
                nattr = *attr;
                *attr = NULL;
                return pctxt->print_error (
                    pctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Entry '%s' already in list but with different type ('%s')",
                    name,
                    nattr->type_name);
            }
            return EXR_ERR_SUCCESS;
        }
        return rval;
    }

    mlen = (int32_t) pctxt->max_name_length;
    slen = strlen (name);
    if (slen > (size_t) mlen)
    {
        return pctxt->print_error (
            pctxt,
            EXR_ERR_NAME_TOO_LONG,
            "Provided name '%s' too long for file (len %d, max %d)",
            name,
            (int) slen,
            mlen);
    }
    nlen = (int32_t) slen;

    tidx = ((int) type) - 1;
    if (tidx < 0 || tidx >= the_predefined_attr_count)
    {
        if (type == EXR_ATTR_OPAQUE)
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid type enum for '%s': the opaque type is not actually a built-in type",
                name);

        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid type enum for '%s' in create by builtin type (type %d)",
            name,
            (int) type);
    }
    known = &(the_predefined_attr_typenames[tidx]);

    rval = create_attr_block (
        pctxt, &nattr, known->exp_size, data_len, data_ptr, NULL, 0, NULL, 0);

    if (rval == EXR_ERR_SUCCESS)
    {
        nattr->name             = name;
        nattr->type_name        = known->name;
        nattr->name_length      = (uint8_t) nlen;
        nattr->type_name_length = (uint8_t) known->name_len;
        nattr->type             = known->type;
        rval                    = add_to_list (pctxt, list, nattr, name);
    }

    if (rval == EXR_ERR_SUCCESS)
    {
        *attr = nattr;
        check_attr_handler (pctxt, nattr);
    }
    else if (data_ptr)
        *data_ptr = NULL;
    return rval;
}